

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSA.h
# Opt level: O1

void __thiscall RSA::encrypt(RSA *this,char *__block,int __edflag)

{
  string *this_00;
  _Rb_tree_header *p_Var1;
  char cVar2;
  Conversion *pCVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  undefined4 in_register_00000014;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  BigInt message;
  BigInt cipher;
  set<char,_std::less<char>,_std::allocator<char>_> vocab_set;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  BigInt local_f8;
  string local_d8;
  BigInt local_b8;
  BigInt local_98;
  string local_78;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_58;
  
  std::set<char,std::less<char>,std::allocator<char>>::
  set<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((set<char,std::less<char>,std::allocator<char>> *)&local_58,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__block[8],
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__block[8] + *(long *)(__block + 0x10)));
  std::operator+(&local_118,"_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_register_00000014,__edflag));
  this_00 = (string *)(__block + 0x28);
  std::__cxx11::string::operator=(this_00,(string *)&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if (*(long *)(__block + 0x30) != 0) {
    pcVar6 = *(char **)(__block + 0x28);
    pcVar5 = pcVar6 + *(long *)(__block + 0x30);
    p_Var1 = &local_58._M_impl.super__Rb_tree_header;
    do {
      cVar2 = *pcVar6;
      p_Var7 = &p_Var1->_M_header;
      for (p_Var8 = local_58._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var8 != (_Rb_tree_header *)0x0;
          p_Var8 = (&p_Var8->_M_left)[(char)*(size_t *)(p_Var8 + 1) < cVar2]) {
        if (cVar2 <= (char)*(size_t *)(p_Var8 + 1)) {
          p_Var7 = p_Var8;
        }
      }
      p_Var8 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
         (p_Var8 = p_Var7, cVar2 < (char)p_Var7[1]._M_color)) {
        p_Var8 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var8 == p_Var1) {
        std::__cxx11::string::_M_replace((ulong)this_00,0,*(char **)(__block + 0x30),0x10d03a);
        std::__cxx11::string::_M_assign((string *)(__block + 0x48));
        __block[0x178] = '\x01';
        __block[0x179] = '\0';
        __block[0x17a] = '\0';
        __block[0x17b] = '\0';
        if (*(long *)(__block + 0x168) != *(long *)(__block + 0x160)) {
          *(long *)(__block + 0x168) = *(long *)(__block + 0x160);
        }
        (this->super_Crypto)._vptr_Crypto =
             (_func_int **)&(this->super_Crypto).vocabulary._M_string_length;
        std::__cxx11::string::_M_construct<char_const*>((string *)this,"");
        goto LAB_001049a3;
      }
      pcVar6 = pcVar6 + 1;
    } while (pcVar6 != pcVar5);
  }
  pCVar3 = *(Conversion **)(__block + 0x1a0);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,*(long *)(__block + 0x28),
             *(long *)(__block + 0x30) + *(long *)(__block + 0x28));
  Conversion::convert_to_num_base((BigInt *)&local_118,pCVar3,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  *(undefined4 *)(__block + 0x178) = local_118.field_2._8_4_;
  std::vector<long_long,_std::allocator<long_long>_>::operator=
            ((vector<long_long,_std::allocator<long_long>_> *)(__block + 0x160),
             (vector<long_long,_std::allocator<long_long>_> *)&local_118);
  bVar4 = BigInt::operator<((BigInt *)&local_118,(BigInt *)(__block + 0xe0));
  if (bVar4) {
    std::vector<long_long,_std::allocator<long_long>_>::vector
              (&local_98.vector_value,
               (vector<long_long,_std::allocator<long_long>_> *)(__block + 0x120));
    local_98.sign = *(int *)(__block + 0x138);
    BigInt::powMod(&local_f8,(BigInt *)&local_118,&local_98,(BigInt *)(__block + 0xe0));
    if (local_98.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.vector_value.
                      super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    *(int *)(__block + 0x198) = local_f8.sign;
    std::vector<long_long,_std::allocator<long_long>_>::operator=
              ((vector<long_long,_std::allocator<long_long>_> *)(__block + 0x180),
               &local_f8.vector_value);
    pCVar3 = *(Conversion **)(__block + 0x1a0);
    std::vector<long_long,_std::allocator<long_long>_>::vector
              (&local_b8.vector_value,&local_f8.vector_value);
    local_b8.sign = local_f8.sign;
    Conversion::convert_to_voacb_base_abi_cxx11_(&local_78,pCVar3,&local_b8);
    std::__cxx11::string::operator=((string *)(__block + 0x48),(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if (local_b8.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.vector_value.
                      super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    (this->super_Crypto)._vptr_Crypto =
         (_func_int **)&(this->super_Crypto).vocabulary._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)this,*(long *)(__block + 0x48),
               *(long *)(__block + 0x50) + *(long *)(__block + 0x48));
    if (local_f8.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.vector_value.
                      super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    std::__cxx11::string::_M_replace((ulong)this_00,0,*(char **)(__block + 0x30),0x10d077);
    std::__cxx11::string::_M_assign((string *)(__block + 0x48));
    __block[0x178] = '\x01';
    __block[0x179] = '\0';
    __block[0x17a] = '\0';
    __block[0x17b] = '\0';
    if (*(long *)(__block + 0x168) != *(long *)(__block + 0x160)) {
      *(long *)(__block + 0x168) = *(long *)(__block + 0x160);
    }
    (this->super_Crypto)._vptr_Crypto =
         (_func_int **)&(this->super_Crypto).vocabulary._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)this,"");
  }
  if (local_118._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_118._M_dataplus._M_p);
  }
LAB_001049a3:
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::~_Rb_tree
            (&local_58);
  return;
}

Assistant:

string RSA::encrypt(string pPlainText) {
    set<char> vocab_set(vocabulary.begin(), vocabulary.end());
    plainText = "_" + pPlainText; //! some character may be zero

    for (auto plain_char:plainText)
        if (vocab_set.find(plain_char) == vocab_set.end()) {
            cipherText = plainText = "Some letter in the plain text is not contained in vocabulary";
            plain_BigInt = 0;
            return "";
        }
    BigInt message = conversion->convert_to_num_base(plainText);

    plain_BigInt = message;

    if (message >= n) {
        cipherText = plainText = "The message is to large to fit into n space";
        plain_BigInt = 0;
        return "";
    }

    BigInt cipher = message.powMod(e, n);
    cipher_BigInt = cipher;
    cipherText = conversion->convert_to_voacb_base(cipher);
    return cipherText;
}